

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

CTypeID ffi_checkctype(lua_State *L,CTState *cts,TValue *param)

{
  TValue *pTVar1;
  int errcode_00;
  ulong uVar2;
  uint local_cc;
  GCcdata *cd;
  undefined1 local_b8 [4];
  int errcode;
  CPState cp;
  GCstr *s;
  TValue *o;
  TValue *param_local;
  CTState *cts_local;
  lua_State *L_local;
  
  pTVar1 = L->base;
  if (pTVar1 < L->top) {
    if ((int)(pTVar1->field_4).it >> 0xf == -5) {
      cp._120_8_ = pTVar1->u64 & 0x7fffffffffff;
      cp.param = (TValue *)(cp._120_8_ + 0x18);
      cp.ct = (CType *)(cp._120_8_ + 0x18);
      cp.depth = 0x12;
      cp.sb.L.ptr64 = (uint64_t)L;
      cp.L = (lua_State *)cts;
      cp.cts = (CTState *)param;
      errcode_00 = lj_cparse((CPState *)local_b8);
      if (errcode_00 != 0) {
        lj_err_throw(L,errcode_00);
      }
      L_local._4_4_ = cp.tok;
    }
    else {
      if ((int)(pTVar1->field_4).it >> 0xf != -0xb) goto LAB_0015c363;
      if ((param != (TValue *)0x0) && (param < L->top)) {
        lj_err_arg(L,1,LJ_ERR_FFI_NUMPARAM);
      }
      uVar2 = pTVar1->u64 & 0x7fffffffffff;
      if (*(short *)(uVar2 + 10) == 0x16) {
        local_cc = *(uint *)(uVar2 + 0x10);
      }
      else {
        local_cc = (uint)*(ushort *)(uVar2 + 10);
      }
      L_local._4_4_ = local_cc;
    }
    return L_local._4_4_;
  }
LAB_0015c363:
  lj_err_argtype(L,1,"C type");
}

Assistant:

static CTypeID ffi_checkctype(lua_State *L, CTState *cts, TValue *param)
{
  TValue *o = L->base;
  if (!(o < L->top)) {
  err_argtype:
    lj_err_argtype(L, 1, "C type");
  }
  if (tvisstr(o)) {  /* Parse an abstract C type declaration. */
    GCstr *s = strV(o);
    CPState cp;
    int errcode;
    cp.L = L;
    cp.cts = cts;
    cp.srcname = strdata(s);
    cp.p = strdata(s);
    cp.param = param;
    cp.mode = CPARSE_MODE_ABSTRACT|CPARSE_MODE_NOIMPLICIT;
    errcode = lj_cparse(&cp);
    if (errcode) lj_err_throw(L, errcode);  /* Propagate errors. */
    return cp.val.id;
  } else {
    GCcdata *cd;
    if (!tviscdata(o)) goto err_argtype;
    if (param && param < L->top) lj_err_arg(L, 1, LJ_ERR_FFI_NUMPARAM);
    cd = cdataV(o);
    return cd->ctypeid == CTID_CTYPEID ? *(CTypeID *)cdataptr(cd) : cd->ctypeid;
  }
}